

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

bool MeCab::anon_unknown_21::is_valid_node<mecab_node_t>(Lattice *lattice,mecab_node_t *node)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 *puVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined8 *local_58;
  undefined8 *local_50;
  char *local_48;
  char *local_40;
  ulong local_38;
  
  pcVar13 = node->surface;
  iVar6 = (*lattice->_vptr_Lattice[8])();
  uVar3 = node->length;
  iVar7 = (*lattice->_vptr_Lattice[0x1f])
                    (lattice,pcVar13 + ((ulong)uVar3 - CONCAT44(extraout_var,iVar6)));
  if (iVar7 != 2) {
    pcVar9 = node->surface;
    iVar7 = (*lattice->_vptr_Lattice[8])(lattice);
    uVar4 = node->length;
    uVar5 = node->rlength;
    iVar8 = (*lattice->_vptr_Lattice[0x20])
                      (lattice,pcVar9 + ((ulong)uVar4 -
                                        ((ulong)uVar5 + CONCAT44(extraout_var_00,iVar7))));
    pcVar16 = (char *)CONCAT44(extraout_var_01,iVar8);
    if (pcVar16 == (char *)0x0) {
      return true;
    }
    iVar7 = (*lattice->_vptr_Lattice[0x1f])
                      (lattice,pcVar9 + ((ulong)uVar4 -
                                        ((ulong)uVar5 + CONCAT44(extraout_var_00,iVar7))));
    if ((iVar7 == 1) &&
       (iVar6 = (*lattice->_vptr_Lattice[0x1f])
                          (lattice,pcVar13 + ((ulong)uVar3 - CONCAT44(extraout_var,iVar6))),
       iVar6 == 1)) {
      pcVar13 = node->feature;
      iVar6 = strcmp(pcVar16,"*");
      if (iVar6 == 0) {
        return true;
      }
      pcVar9 = (char *)operator_new__(0x2000);
      local_40 = pcVar9;
      pcVar10 = (char *)operator_new__(0x2000);
      local_48 = pcVar10;
      local_58 = (undefined8 *)operator_new__(0x200);
      local_50 = (undefined8 *)operator_new__(0x200);
      strncpy(pcVar9,pcVar16,0x2000);
      strncpy(pcVar10,pcVar13,0x2000);
      sVar11 = strlen(pcVar9);
      if ((long)sVar11 < 1) {
        uVar15 = 0;
      }
      else {
        pcVar13 = pcVar9 + sVar11;
        uVar17 = 0x40;
        uVar15 = 0;
        puVar12 = local_58;
        do {
          for (; (cVar2 = *pcVar9, cVar2 == '\t' || (cVar2 == ' ')); pcVar9 = pcVar9 + 1) {
          }
          if (cVar2 == '\"') {
            pcVar9 = pcVar9 + 1;
            pcVar16 = pcVar9;
            for (pcVar10 = pcVar9;
                (pcVar14 = pcVar10, pcVar10 < pcVar13 &&
                ((*pcVar10 != '\"' ||
                 (pcVar14 = pcVar10 + 1, pcVar1 = pcVar10 + 1, pcVar10 = pcVar14, *pcVar1 == '\"')))
                ); pcVar10 = pcVar10 + 1) {
              *pcVar16 = *pcVar10;
              pcVar16 = pcVar16 + 1;
            }
            local_5b = 0x2c;
            pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pcVar14,pcVar13,&local_5b);
          }
          else {
            local_5c = 0x2c;
            pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pcVar9,pcVar13,&local_5c);
            pcVar16 = pcVar10;
          }
          if (1 < uVar17) {
            *pcVar16 = '\0';
          }
          uVar17 = uVar17 - 1;
          *puVar12 = pcVar9;
          uVar15 = uVar15 + 1;
          if (uVar17 == 0) break;
          puVar12 = puVar12 + 1;
          pcVar9 = pcVar10 + 1;
        } while (pcVar9 < pcVar13);
      }
      pcVar13 = local_48;
      sVar11 = strlen(local_48);
      if ((long)sVar11 < 1) {
        uVar17 = 0;
      }
      else {
        pcVar9 = pcVar13 + sVar11;
        uVar18 = 0x40;
        uVar17 = 0;
        puVar12 = local_50;
        local_38 = uVar15;
        do {
          for (; (cVar2 = *pcVar13, cVar2 == '\t' || (cVar2 == ' ')); pcVar13 = pcVar13 + 1) {
          }
          if (cVar2 == '\"') {
            pcVar13 = pcVar13 + 1;
            pcVar16 = pcVar13;
            for (pcVar10 = pcVar13;
                (pcVar14 = pcVar10, pcVar10 < pcVar9 &&
                ((*pcVar10 != '\"' ||
                 (pcVar14 = pcVar10 + 1, pcVar1 = pcVar10 + 1, pcVar10 = pcVar14, *pcVar1 == '\"')))
                ); pcVar10 = pcVar10 + 1) {
              *pcVar16 = *pcVar10;
              pcVar16 = pcVar16 + 1;
            }
            local_59 = 0x2c;
            pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pcVar14,pcVar9,&local_59);
          }
          else {
            local_5a = 0x2c;
            pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pcVar13,pcVar9,&local_5a);
            pcVar16 = pcVar10;
          }
          if (1 < uVar18) {
            *pcVar16 = '\0';
          }
          uVar18 = uVar18 - 1;
          *puVar12 = pcVar13;
          uVar17 = uVar17 + 1;
          uVar15 = local_38;
          if (uVar18 == 0) break;
          puVar12 = puVar12 + 1;
          pcVar13 = pcVar10 + 1;
        } while (pcVar13 < pcVar9);
      }
      puVar12 = local_58;
      if (uVar17 < uVar15) {
        uVar15 = uVar17;
      }
      bVar19 = uVar15 == 0;
      if (!bVar19) {
        uVar17 = 1;
        do {
          pcVar13 = (char *)puVar12[uVar17 - 1];
          iVar6 = strcmp(pcVar13,"*");
          if ((iVar6 != 0) && (iVar6 = strcmp(pcVar13,(char *)local_50[uVar17 - 1]), iVar6 != 0))
          break;
          bVar19 = uVar15 <= uVar17;
          bVar20 = uVar17 != uVar15;
          uVar17 = uVar17 + 1;
        } while (bVar20);
      }
      operator_delete__(local_50);
      operator_delete__(puVar12);
      operator_delete__(local_48);
      operator_delete__(local_40);
      if (bVar19) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool is_valid_node(const Lattice *lattice,  N *node) {
  const size_t end_pos = node->surface - lattice->sentence() + node->length;
  if (lattice->boundary_constraint(end_pos) == MECAB_INSIDE_TOKEN) {
    return false;
  }
  const size_t begin_pos =
      node->surface - lattice->sentence() + node->length - node->rlength;
  const char *feature = lattice->feature_constraint(begin_pos);
  if (!feature) {
    return true;
  }
  if (lattice->boundary_constraint(begin_pos) == MECAB_TOKEN_BOUNDARY &&
      lattice->boundary_constraint(end_pos) == MECAB_TOKEN_BOUNDARY &&
      partial_match(feature, node->feature)) {
    return true;
  }
  return false;
}